

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O3

asn_enc_rval_t *
SET_OF_encode_der(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *ptr,
                 int tag_mode,ber_tlv_tag_t tag,asn_app_consume_bytes_f *cb,void *app_key)

{
  undefined8 *puVar1;
  asn_TYPE_member_s *paVar2;
  asn_TYPE_descriptor_s *paVar3;
  der_type_encoder_f *pdVar4;
  void *pvVar5;
  int iVar6;
  undefined8 *__base;
  void *pvVar7;
  _el_buffer *encoded_el;
  long lVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  size_t __nmemb;
  ulong __size;
  size_t struct_length;
  ssize_t sVar12;
  bool bVar13;
  long local_90;
  asn_enc_rval_t local_48;
  
  paVar2 = td->elements;
  paVar3 = paVar2->type;
  pdVar4 = paVar3->der_encoder;
  iVar6 = *(int *)((long)ptr + 8);
  __size = 1;
  if (iVar6 < 1) {
    struct_length = 0;
  }
  else {
    lVar8 = 0;
    struct_length = 0;
    do {
      pvVar5 = *(void **)(*ptr + lVar8 * 8);
      if (pvVar5 != (void *)0x0) {
        (*pdVar4)(__return_storage_ptr__,paVar3,pvVar5,0,paVar2->tag,(asn_app_consume_bytes_f *)0x0,
                  (void *)0x0);
        uVar9 = __return_storage_ptr__->encoded;
        if (uVar9 == 0xffffffffffffffff) {
          return __return_storage_ptr__;
        }
        struct_length = struct_length + uVar9;
        if (__size <= uVar9) {
          __size = uVar9;
        }
        iVar6 = *(int *)((long)ptr + 8);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
  }
  local_90 = der_write_tags(td,struct_length,tag_mode,1,tag,cb,app_key);
  if (local_90 == -1) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
LAB_00145c12:
    __return_storage_ptr__->structure_ptr = ptr;
  }
  else {
    sVar12 = struct_length + local_90;
    if (cb != (asn_app_consume_bytes_f *)0x0) {
      iVar6 = *(int *)((long)ptr + 8);
      uVar9 = (ulong)iVar6;
      if (uVar9 != 0) {
        __base = (undefined8 *)malloc(uVar9 * 0x18);
        if (__base == (undefined8 *)0x0) {
LAB_00145c01:
          __return_storage_ptr__->encoded = -1;
          __return_storage_ptr__->failed_type = td;
          goto LAB_00145c12;
        }
        if (iVar6 < 1) {
          qsort(__base,0,0x18,_el_buf_cmp);
          bVar13 = true;
        }
        else {
          lVar8 = 0;
          __nmemb = 0;
          puVar10 = __base;
          do {
            pvVar5 = *(void **)(*ptr + lVar8 * 8);
            if (pvVar5 != (void *)0x0) {
              puVar1 = __base + __nmemb * 3;
              pvVar7 = malloc(__size);
              *puVar1 = pvVar7;
              if (pvVar7 != (void *)0x0) {
                puVar1[1] = 0;
                puVar1[2] = __size;
                (*pdVar4)(&local_48,paVar3,pvVar5,0,paVar2->tag,_el_addbytes,puVar1);
                __return_storage_ptr__->structure_ptr = local_48.structure_ptr;
                __return_storage_ptr__->encoded = local_48.encoded;
                __return_storage_ptr__->failed_type = local_48.failed_type;
                if (__return_storage_ptr__->encoded == -1) {
                  lVar8 = lVar8 + 1;
                  do {
                    free((void *)*puVar10);
                    puVar10 = puVar10 + -3;
                    lVar11 = lVar8 + -1;
                    bVar13 = 0 < lVar8;
                    lVar8 = lVar11;
                  } while (lVar11 != 0 && bVar13);
                  free(__base);
                  return __return_storage_ptr__;
                }
                local_90 = local_90 + __return_storage_ptr__->encoded;
                __nmemb = __nmemb + 1;
                uVar9 = (ulong)*(uint *)((long)ptr + 8);
                goto LAB_00145b22;
              }
              if (lVar8 != 0) {
                lVar8 = lVar8 + 1;
                do {
                  free((void *)__base[(ulong)((int)lVar8 - 2) * 3]);
                  lVar8 = lVar8 + -1;
                } while (1 < lVar8);
              }
              free(__base);
              goto LAB_00145c01;
            }
LAB_00145b22:
            lVar8 = lVar8 + 1;
            puVar10 = puVar10 + 3;
          } while (lVar8 < (int)uVar9);
          qsort(__base,__nmemb,0x18,_el_buf_cmp);
          if ((long)__nmemb < 1) {
            bVar13 = true;
          }
          else {
            iVar6 = 0;
            puVar10 = __base;
            do {
              bVar13 = iVar6 == 0;
              iVar6 = -1;
              if (bVar13) {
                iVar6 = (*cb)((void *)*puVar10,puVar10[1],app_key);
                iVar6 = iVar6 >> 0x1f;
              }
              free((void *)*puVar10);
              puVar10 = puVar10 + 3;
              __nmemb = __nmemb - 1;
            } while (__nmemb != 0);
            bVar13 = iVar6 == 0;
          }
        }
        free(__base);
        if (sVar12 != local_90) {
          sVar12 = -1;
        }
        if (!bVar13) {
          sVar12 = -1;
        }
      }
    }
    __return_storage_ptr__->encoded = sVar12;
    __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
SET_OF_encode_der(asn_TYPE_descriptor_t *td, void *ptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	asn_TYPE_member_t *elm = td->elements;
	asn_TYPE_descriptor_t *elm_type = elm->type;
	der_type_encoder_f *der_encoder = elm_type->der_encoder;
	asn_anonymous_set_ *list = _A_SET_FROM_VOID(ptr);
	size_t computed_size = 0;
	ssize_t encoding_size = 0;
	struct _el_buffer *encoded_els;
	ssize_t eels_count = 0;
	size_t max_encoded_len = 1;
	asn_enc_rval_t erval;
	int ret;
	int edx;

	ASN_DEBUG("Estimating size for SET OF %s", td->name);

	/*
	 * Gather the length of the underlying members sequence.
	 */
	for(edx = 0; edx < list->count; edx++) {
		void *memb_ptr = list->array[edx];
		if(!memb_ptr) continue;
		erval = der_encoder(elm_type, memb_ptr, 0, elm->tag, 0, 0);
		if(erval.encoded == -1)
			return erval;
		computed_size += erval.encoded;

		/* Compute maximum encoding's size */
		if(max_encoded_len < (size_t)erval.encoded)
			max_encoded_len = erval.encoded;
	}

	/*
	 * Encode the TLV for the sequence itself.
	 */
	encoding_size = der_write_tags(td, computed_size, tag_mode, 1, tag,
		cb, app_key);
	if(encoding_size == -1) {
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
		return erval;
	}
	computed_size += encoding_size;

	if(!cb || list->count == 0) {
		erval.encoded = computed_size;
		ASN__ENCODED_OK(erval);
	}

	/*
	 * DER mandates dynamic sorting of the SET OF elements
	 * according to their encodings. Build an array of the
	 * encoded elements.
	 */
	encoded_els = (struct _el_buffer *)MALLOC(
				list->count * sizeof(encoded_els[0]));
	if(encoded_els == NULL) {
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
		return erval;
	}

	ASN_DEBUG("Encoding members of %s SET OF", td->name);

	/*
	 * Encode all members.
	 */
	for(edx = 0; edx < list->count; edx++) {
		void *memb_ptr = list->array[edx];
		struct _el_buffer *encoded_el = &encoded_els[eels_count];

		if(!memb_ptr) continue;

		/*
		 * Prepare space for encoding.
		 */
		encoded_el->buf = (uint8_t *)MALLOC(max_encoded_len);
		if(encoded_el->buf) {
			encoded_el->length = 0;
			encoded_el->size = max_encoded_len;
		} else {
			for(edx--; edx >= 0; edx--)
				FREEMEM(encoded_els[edx].buf);
			FREEMEM(encoded_els);
			erval.encoded = -1;
			erval.failed_type = td;
			erval.structure_ptr = ptr;
			return erval;
		}

		/*
		 * Encode the member into the prepared space.
		 */
		erval = der_encoder(elm_type, memb_ptr, 0, elm->tag,
			_el_addbytes, encoded_el);
		if(erval.encoded == -1) {
			for(; edx >= 0; edx--)
				FREEMEM(encoded_els[edx].buf);
			FREEMEM(encoded_els);
			return erval;
		}
		encoding_size += erval.encoded;
		eels_count++;
	}

	/*
	 * Sort the encoded elements according to their encoding.
	 */
	qsort(encoded_els, eels_count, sizeof(encoded_els[0]), _el_buf_cmp);

	/*
	 * Report encoded elements to the application.
	 * Dispose of temporary sorted members table.
	 */
	ret = 0;
	for(edx = 0; edx < eels_count; edx++) {
		struct _el_buffer *encoded_el = &encoded_els[edx];
		/* Report encoded chunks to the application */
		if(ret == 0
		&& cb(encoded_el->buf, encoded_el->length, app_key) < 0)
			ret = -1;
		FREEMEM(encoded_el->buf);
	}
	FREEMEM(encoded_els);

	if(ret || computed_size != (size_t)encoding_size) {
		/*
		 * Standard callback failed, or
		 * encoded size is not equal to the computed size.
		 */
		erval.encoded = -1;
		erval.failed_type = td;
		erval.structure_ptr = ptr;
	} else {
		erval.encoded = computed_size;
	}

	ASN__ENCODED_OK(erval);
}